

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

char * pigpio_error(int errnum)

{
  long lVar1;
  
  if (-1000 < errnum) {
    lVar1 = 8;
    do {
      if (*(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar1) == errnum) {
        return *(char **)((long)&errInfo[0].error + lVar1);
      }
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x908);
    return "unknown error";
  }
  if (10 < errnum + 0x7daU) {
    return "unknown error";
  }
  return &DAT_001091cc + *(int *)(&DAT_001091cc + (ulong)(errnum + 0x7daU) * 4);
}

Assistant:

char *pigpio_error(int errnum)
{
   if (errnum > -1000) return cmdErrStr(errnum);
   else
   {
      switch(errnum)
      {
         case pigif_bad_send:
            return "failed to send to pigpiod";
         case pigif_bad_recv:
            return "failed to receive from pigpiod";
         case pigif_bad_getaddrinfo:
            return "failed to find address of pigpiod";
         case pigif_bad_connect:
            return "failed to connect to pigpiod";
         case pigif_bad_socket:
            return "failed to create socket";
         case pigif_bad_noib:
            return "failed to open noib";
         case pigif_duplicate_callback:
            return "identical callback exists";
         case pigif_bad_malloc:
            return "failed to malloc";
         case pigif_bad_callback:
            return "bad callback parameter";
         case pigif_notify_failed:
            return "failed to create notification thread";
         case pigif_callback_not_found:
            return "callback not found";
         default:
            return "unknown error";
      }
   }
}